

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O3

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
valueByteSize(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  ValueLength VVar4;
  byte bVar5;
  ulong uVar6;
  byte *pbVar7;
  byte *pbVar8;
  
  pbVar1 = *(byte **)this;
  bVar3 = *pbVar1;
  if ((bVar3 & 0xfe) == 0xee) {
    bVar5 = 0;
    pbVar7 = pbVar1;
    do {
      pbVar8 = pbVar7 + 9;
      cVar2 = '\t';
      if (bVar3 == 0xee) {
        cVar2 = '\x02';
        pbVar8 = pbVar7 + 2;
      }
      bVar5 = bVar5 + cVar2;
      bVar3 = *pbVar8;
      pbVar7 = pbVar8;
    } while ((bVar3 & 0xfe) == 0xee);
    uVar6 = (ulong)bVar5;
    bVar3 = pbVar1[uVar6];
  }
  else {
    uVar6 = 0;
  }
  if ((ulong)"\x01\x01"[bVar3] != 0) {
    return (ulong)"\x01\x01"[bVar3];
  }
  VVar4 = byteSizeDynamic(this,pbVar1 + uVar6);
  return VVar4;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }